

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O3

unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> __thiscall
flatbuffers::FlatCompiler::GenerateCode
          (FlatCompiler *this,FlatCOptions *options,Parser *conform_parser)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *filepath;
  byte bVar1;
  byte bVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  long lVar5;
  long *plVar6;
  _Head_base<0UL,_flatbuffers::Parser_*,_false> _Var7;
  size_type sVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  Parser *pPVar12;
  undefined8 uVar13;
  uint8_t *puVar14;
  long *plVar15;
  long *plVar16;
  Parser *in_RCX;
  size_type *psVar17;
  ulong *puVar18;
  long *plVar19;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  _Alloc_hider _Var23;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reuse_tracker;
  string filebase;
  string contents;
  string ext;
  IDLOptions opts;
  string local_548;
  _Head_base<0UL,_flatbuffers::Parser_*,_false> local_520;
  string local_518;
  _Base_ptr local_4f8;
  undefined4 local_4ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 local_4c8 [64];
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  long local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  int local_444;
  string local_440;
  uint8_t *local_420;
  long *local_418;
  long local_410;
  long local_408;
  long lStack_400;
  _Base_ptr *local_3f8;
  ulong local_3f0;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  Parser *local_388;
  string local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_360 [2];
  ulong local_350 [2];
  undefined1 local_340 [576];
  size_type local_100;
  unsigned_long local_a8;
  
  local_388 = in_RCX;
  pPVar12 = (Parser *)operator_new(0x780);
  Parser::Parser(pPVar12,(IDLOptions *)conform_parser);
  *(Parser **)&(this->code_generators_)._M_t._M_impl = pPVar12;
  local_4f8 = (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
  local_520._M_head_impl = (Parser *)this;
  if (local_4f8 !=
      (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    local_3f8 = &(conform_parser->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_parent;
    filepath = &(conform_parser->file_extension_).field_2;
    do {
      IDLOptions::IDLOptions((IDLOptions *)local_340,(IDLOptions *)conform_parser);
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      local_440._M_string_length = 0;
      local_440.field_2._M_local_buf[0] = '\0';
      bVar9 = LoadFile(*(char **)local_4f8,true,&local_440);
      if (!bVar9) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4c8,"unable to load file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8);
        (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                  (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c8,1,1);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
        }
      }
      lVar21 = (long)local_4f8 -
               (long)(conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
      p_Var3 = (conform_parser->known_attributes_)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_right;
      GetExtension(&local_380,(string *)local_4f8);
      uVar13 = std::__cxx11::string::compare((char *)&local_380);
      if (((int)uVar13 == 0) ||
         (uVar13 = std::__cxx11::string::compare((char *)&local_380), (int)uVar13 == 0)) {
        local_4ec = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),1);
        if (local_100 == 0) {
          StripFileName((string *)local_4c8,(string *)local_4f8);
          std::__cxx11::string::operator=((string *)(local_340 + 0x238),(string *)local_4c8);
          if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
            operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
          }
        }
      }
      else {
        local_4ec = 0;
      }
      iVar11 = std::__cxx11::string::compare((char *)&local_380);
      sVar8 = local_440._M_string_length;
      local_444 = iVar11;
      if ((_Base_ptr)(lVar21 >> 5) < p_Var3) {
        if (((iVar11 != 0) && (local_340[1] == false)) &&
           (puVar14 = (uint8_t *)strlen(local_440._M_dataplus._M_p), (uint8_t *)sVar8 != puVar14)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c8,"input file appears to be binary: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4f8);
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4c8,1,1);
          if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
            operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
          }
        }
        bVar20 = iVar11 == 0 | (byte)local_4ec;
        if (bVar20 == 1) {
          pPVar12 = (Parser *)operator_new(0x780);
          Parser::Parser(pPVar12,(IDLOptions *)local_340);
          std::__uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
          reset((__uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *)
                local_520._M_head_impl,pPVar12);
          if (local_444 != 0) goto LAB_002fb309;
          LoadBinarySchema((FlatCompiler *)options,
                           (Parser *)((local_520._M_head_impl)->super_ParserState).prev_cursor_,
                           (string *)local_4f8,&local_440);
LAB_002fb705:
          lVar5._0_1_ = (conform_parser->opts).gen_jvmstatic;
          lVar5._1_1_ = (conform_parser->opts).use_flexbuffers;
          lVar5._2_1_ = (conform_parser->opts).strict_json;
          lVar5._3_1_ = (conform_parser->opts).output_default_scalars_in_json;
          lVar5._4_4_ = (conform_parser->opts).indent_step;
          bVar9 = lVar5 == 0;
        }
        else {
LAB_002fb309:
          _Var23._M_p = local_440._M_dataplus._M_p;
          _Var7._M_head_impl = local_520._M_head_impl;
          if (local_340[1] == true) {
            if (local_a8 == 0x80) {
              local_548._M_dataplus._M_p = (pointer)0x0;
              local_548._M_string_length = 0;
              local_548.field_2._M_allocated_capacity = 0;
              local_420 = (uint8_t *)local_440._M_string_length;
              flexbuffers::Verifier::Verifier
                        ((Verifier *)local_4c8,(uint8_t *)local_440._M_dataplus._M_p,
                         local_440._M_string_length,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_548,true,
                         0x40);
              bVar9 = flexbuffers::Verifier::VerifyBuffer((Verifier *)local_4c8);
              if (!bVar9) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8,"flexbuffers file failed to verify: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4f8);
                (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                          (options,(Verifier *)local_4c8,0,1);
                if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
                  operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
                }
              }
              puVar14 = local_420 + (long)_Var23._M_p;
              bVar1 = puVar14[-2];
              bVar2 = puVar14[-1];
              pcVar4 = ((local_520._M_head_impl)->super_ParserState).prev_cursor_;
              *(ulong *)(pcVar4 + 0x2e8) = (long)(puVar14 + -2) - (ulong)bVar2;
              *(ulong *)(pcVar4 + 0x2f0) =
                   (1L << (bVar1 & 3)) << 8 | (ulong)(bVar1 >> 2) << 0x20 | (ulong)bVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                uVar22 = local_548.field_2._M_allocated_capacity - (long)local_548._M_dataplus._M_p;
                _Var23._M_p = local_548._M_dataplus._M_p;
LAB_002fb62f:
                operator_delete(_Var23._M_p,uVar22);
              }
            }
            else {
              flexbuffers::Builder::Clear
                        ((Builder *)
                         (((local_520._M_head_impl)->super_ParserState).prev_cursor_ + 0x248));
              ParseFile((FlatCompiler *)options,
                        (Parser *)((_Var7._M_head_impl)->super_ParserState).prev_cursor_,
                        (string *)local_4f8,&local_440,
                        (vector<const_char_*,_std::allocator<const_char_*>_> *)local_3f8);
            }
          }
          else {
            ParseFile((FlatCompiler *)options,
                      (Parser *)((local_520._M_head_impl)->super_ParserState).prev_cursor_,
                      (string *)local_4f8,&local_440,
                      (vector<const_char_*,_std::allocator<const_char_*>_> *)local_3f8);
            if ((byte)local_4ec != '\0') goto LAB_002fb705;
            if (*(int *)(((local_520._M_head_impl)->super_ParserState).prev_cursor_ + 0x1f8) == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4c8,"input file is neither json nor a .fbs (schema) file: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4f8);
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4c8,1,1);
              if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
                uVar22 = local_4c8._16_8_ + 1;
                _Var23._M_p = (pointer)local_4c8._0_8_;
                goto LAB_002fb62f;
              }
            }
          }
          lVar21._0_1_ = (conform_parser->opts).gen_jvmstatic;
          lVar21._1_1_ = (conform_parser->opts).use_flexbuffers;
          lVar21._2_1_ = (conform_parser->opts).strict_json;
          lVar21._3_1_ = (conform_parser->opts).output_default_scalars_in_json;
          lVar21._4_4_ = (conform_parser->opts).indent_step;
          bVar9 = (bVar20 & lVar21 != 0) == 0;
        }
        if (!bVar9) {
          Parser::ConformTo_abi_cxx11_
                    ((string *)local_4c8,
                     (Parser *)((local_520._M_head_impl)->super_ParserState).prev_cursor_,local_388)
          ;
          if (local_4c8._8_8_ != 0) {
            std::operator+(&local_548,"schemas don\'t conform: ",(string *)local_4c8);
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_548,0,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
            operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
          }
        }
        if ((*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 4
                      ) != '\0') || (bVar20 = 0, local_340[0xfb] == true)) {
          Parser::Serialize((Parser *)((local_520._M_head_impl)->super_ParserState).prev_cursor_);
          bVar20 = *(byte *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus.
                                    _M_p + 4);
        }
        if ((bVar20 & 1) != 0) {
          pcVar4 = ((local_520._M_head_impl)->super_ParserState).prev_cursor_;
          std::__cxx11::string::_M_replace
                    ((ulong)(pcVar4 + 800),0,*(char **)(pcVar4 + 0x328),0x35e7cc);
        }
      }
      else {
        FlatBufferBuilderImpl<false>::Clear
                  ((FlatBufferBuilderImpl<false> *)
                   (((local_520._M_head_impl)->super_ParserState).prev_cursor_ + 0x1c8));
        sVar8 = local_440._M_string_length;
        _Var23._M_p = local_440._M_dataplus._M_p;
        pcVar4 = ((local_520._M_head_impl)->super_ParserState).prev_cursor_;
        if ((uint8_t *)local_440._M_string_length != (uint8_t *)0x0) {
          vector_downward<unsigned_int>::ensure_space
                    ((vector_downward<unsigned_int> *)(pcVar4 + 0x1c8),local_440._M_string_length);
          lVar21 = *(long *)(pcVar4 + 0x208);
          *(void **)(pcVar4 + 0x208) = (void *)(lVar21 - sVar8);
          *(int *)(pcVar4 + 0x1f8) = *(int *)(pcVar4 + 0x1f8) + (int)sVar8;
          memcpy((void *)(lVar21 - sVar8),_Var23._M_p,sVar8);
        }
        pcVar4[0x229] = '\x01';
        if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 3)
            == '\0') {
          pcVar4 = ((local_520._M_head_impl)->super_ParserState).prev_cursor_;
          if (*(long *)(pcVar4 + 0x308) == 0) {
            std::operator+(&local_548,"current schema has no file_identifier: cannot test if \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4f8);
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_548);
            psVar17 = (size_type *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_4c8._16_8_ = *psVar17;
              local_4c8._24_4_ = (undefined4)plVar15[3];
              local_4c8._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
              local_4c8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_4c8 + 0x10);
            }
            else {
              local_4c8._16_8_ = *psVar17;
              local_4c8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar15;
            }
            local_4c8._8_8_ = plVar15[1];
            *plVar15 = (long)psVar17;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,local_4c8,1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_4c8 + 0x10)) {
              operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
            }
            uVar13 = local_548.field_2._M_allocated_capacity;
            _Var23._M_p = local_548._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
LAB_002fb9d0:
              operator_delete(_Var23._M_p,uVar13 + 1);
            }
          }
          else {
            iVar11 = strncmp(local_440._M_dataplus._M_p + (ulong)local_340[0x161] * 4 + 4,
                             *(char **)(pcVar4 + 0x300),4);
            if (iVar11 != 0) {
              std::operator+(&local_4e8,"binary \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4f8);
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_4e8);
              local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
              psVar17 = (size_type *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_518.field_2._M_allocated_capacity = *psVar17;
                local_518.field_2._8_8_ = plVar15[3];
              }
              else {
                local_518.field_2._M_allocated_capacity = *psVar17;
                local_518._M_dataplus._M_p = (pointer)*plVar15;
              }
              local_518._M_string_length = plVar15[1];
              *plVar15 = (long)psVar17;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              plVar15 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_518,
                                           *(ulong *)(((local_520._M_head_impl)->super_ParserState).
                                                      prev_cursor_ + 0x300));
              local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
              puVar18 = (ulong *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18) {
                local_548.field_2._M_allocated_capacity = *puVar18;
                local_548.field_2._8_8_ = plVar15[3];
              }
              else {
                local_548.field_2._M_allocated_capacity = *puVar18;
                local_548._M_dataplus._M_p = (pointer)*plVar15;
              }
              local_548._M_string_length = plVar15[1];
              *plVar15 = (long)puVar18;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_548);
              psVar17 = (size_type *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_4c8._16_8_ = *psVar17;
                local_4c8._24_4_ = (undefined4)plVar15[3];
                local_4c8._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
                local_4c8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_4c8 + 0x10);
              }
              else {
                local_4c8._16_8_ = *psVar17;
                local_4c8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar15;
              }
              local_4c8._8_8_ = plVar15[1];
              *plVar15 = (long)psVar17;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,local_4c8,1,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_4c8 + 0x10)) {
                operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p != &local_548.field_2) {
                operator_delete(local_548._M_dataplus._M_p,
                                local_548.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_518._M_dataplus._M_p != &local_518.field_2) {
                operator_delete(local_518._M_dataplus._M_p,
                                local_518.field_2._M_allocated_capacity + 1);
              }
              uVar13 = local_4e8.field_2._M_allocated_capacity;
              _Var23._M_p = local_4e8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) goto LAB_002fb9d0;
            }
          }
        }
      }
      StripExtension(&local_548,(string *)local_4f8);
      StripPath((string *)local_4c8,&local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
      }
      _Var7._M_head_impl = local_520._M_head_impl;
      local_3f0 = 0;
      local_420 = (uint8_t *)0x0;
      if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 6)
          == '\x01') {
        Parser::Serialize((Parser *)((local_520._M_head_impl)->super_ParserState).prev_cursor_);
        local_420 = FlatBufferBuilderImpl<false>::GetBufferPointer
                              ((FlatBufferBuilderImpl<false> *)
                               (((_Var7._M_head_impl)->super_ParserState).prev_cursor_ + 0x1c8));
        local_3f0 = (ulong)*(uint *)(((_Var7._M_head_impl)->super_ParserState).prev_cursor_ + 0x1f8)
        ;
      }
      plVar6 = (long *)(conform_parser->opts).cpp_object_api_string_type.field_2.
                       _M_allocated_capacity;
      for (plVar15 = (long *)(conform_parser->opts).cpp_object_api_string_type._M_string_length;
          plVar15 != plVar6; plVar15 = plVar15 + 2) {
        if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 2)
            == '\x01') {
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          local_548._M_string_length = 0;
          local_548.field_2._M_allocated_capacity =
               local_548.field_2._M_allocated_capacity & 0xffffffffffffff00;
          iVar11 = (**(code **)(*(long *)*plVar15 + 0x28))
                             ((long *)*plVar15,
                              ((local_520._M_head_impl)->super_ParserState).prev_cursor_,filepath,
                              local_4f8,&local_548);
          if ((iVar11 == 0) && (local_548._M_string_length != 0)) {
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3c8,local_548._M_dataplus._M_p,
                       local_548._M_dataplus._M_p + local_548._M_string_length);
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8," ","");
            local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8," \\","");
            WordWrap(&local_518,&local_3c8,0x50,&local_3e8,&local_3a8);
            puts(local_518._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_dataplus._M_p != &local_518.field_2) {
              operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
              operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar13 = local_3c8.field_2._M_allocated_capacity;
            _Var23._M_p = local_3c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
LAB_002fc0d8:
              operator_delete(_Var23._M_p,uVar13 + 1);
            }
          }
          else {
            (**(code **)(*(long *)*plVar15 + 0x60))(&local_4e8);
            plVar16 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_4e8,0,(char *)0x0,0x37ed4e);
            local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
            psVar17 = (size_type *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_518.field_2._M_allocated_capacity = *psVar17;
              local_518.field_2._8_8_ = plVar16[3];
            }
            else {
              local_518.field_2._M_allocated_capacity = *psVar17;
              local_518._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_518._M_string_length = plVar16[1];
            *plVar16 = (long)psVar17;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_518,1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_dataplus._M_p != &local_518.field_2) {
              operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1
                             );
            }
            uVar13 = local_4e8.field_2._M_allocated_capacity;
            _Var23._M_p = local_4e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) goto LAB_002fc0d8;
          }
LAB_002fc0e0:
          uVar13 = local_548.field_2._M_allocated_capacity;
          _Var23._M_p = local_548._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
LAB_002fc0f3:
            operator_delete(_Var23._M_p,uVar13 + 1);
          }
        }
        else {
          EnsureDirExists((string *)filepath);
          cVar10 = (**(code **)(*(long *)*plVar15 + 0x48))();
          if (cVar10 != '\0') {
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            local_548._M_string_length = 0;
            local_548.field_2._M_allocated_capacity =
                 local_548.field_2._M_allocated_capacity & 0xffffffffffffff00;
            std::__cxx11::string::_M_assign((string *)&local_548);
            iVar11 = (**(code **)(*(long *)*plVar15 + 0x20))
                               ((long *)*plVar15,local_420,local_3f0,&local_548);
            if (iVar11 != 0) {
              (**(code **)(*(long *)*plVar15 + 0x60))(local_360);
              plVar16 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_360,0,(char *)0x0,0x37ed6d);
              local_418 = &local_408;
              plVar19 = plVar16 + 2;
              if ((long *)*plVar16 == plVar19) {
                local_408 = *plVar19;
                lStack_400 = plVar16[3];
              }
              else {
                local_408 = *plVar19;
                local_418 = (long *)*plVar16;
              }
              local_410 = plVar16[1];
              *plVar16 = (long)plVar19;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_418);
              local_468 = &local_458;
              puVar18 = (ulong *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18) {
                local_458._M_allocated_capacity = *puVar18;
                local_458._8_8_ = plVar16[3];
              }
              else {
                local_458._M_allocated_capacity = *puVar18;
                local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar16;
              }
              local_460 = plVar16[1];
              *plVar16 = (long)puVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_468,local_4c8._0_8_);
              local_488 = &local_478;
              plVar19 = plVar16 + 2;
              if ((long *)*plVar16 == plVar19) {
                local_478 = *plVar19;
                lStack_470 = plVar16[3];
              }
              else {
                local_478 = *plVar19;
                local_488 = (long *)*plVar16;
              }
              local_480 = plVar16[1];
              *plVar16 = (long)plVar19;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_488,*(ulong *)(*plVar15 + 8));
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              puVar18 = (ulong *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18) {
                local_4e8.field_2._M_allocated_capacity = *puVar18;
                local_4e8.field_2._8_8_ = plVar16[3];
              }
              else {
                local_4e8.field_2._M_allocated_capacity = *puVar18;
                local_4e8._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_4e8._M_string_length = plVar16[1];
              *plVar16 = (long)puVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_4e8);
              local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
              psVar17 = (size_type *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_518.field_2._M_allocated_capacity = *psVar17;
                local_518.field_2._8_8_ = plVar16[3];
              }
              else {
                local_518.field_2._M_allocated_capacity = *psVar17;
                local_518._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_518._M_string_length = plVar16[1];
              *plVar16 = (long)psVar17;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,&local_518,1,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_518._M_dataplus._M_p != &local_518.field_2) {
                operator_delete(local_518._M_dataplus._M_p,
                                local_518.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
              if (local_488 != &local_478) {
                operator_delete(local_488,local_478 + 1);
              }
              if (local_468 != &local_458) {
                operator_delete(local_468,local_458._M_allocated_capacity + 1);
              }
              if (local_418 != &local_408) {
                operator_delete(local_418,local_408 + 1);
              }
              uVar13 = local_350[0];
              _Var23._M_p = (pointer)local_360[0];
              if (local_360[0] !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350) goto LAB_002fc0d8;
            }
            goto LAB_002fc0e0;
          }
          cVar10 = (**(code **)(*(long *)*plVar15 + 0x40))();
          if (((local_444 == 0) || (cVar10 != '\x01' || (byte)local_4ec != '\0')) &&
             (iVar11 = (**(code **)(*(long *)*plVar15 + 0x10))
                                 ((long *)*plVar15,
                                  ((local_520._M_head_impl)->super_ParserState).prev_cursor_,
                                  filepath,local_4c8), iVar11 != 0)) {
            (**(code **)(*(long *)*plVar15 + 0x60))(&local_468);
            plVar16 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_468,0,(char *)0x0,0x37ed6d);
            local_488 = &local_478;
            plVar19 = plVar16 + 2;
            if ((long *)*plVar16 == plVar19) {
              local_478 = *plVar19;
              lStack_470 = plVar16[3];
            }
            else {
              local_478 = *plVar19;
              local_488 = (long *)*plVar16;
            }
            local_480 = plVar16[1];
            *plVar16 = (long)plVar19;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_488);
            local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
            puVar18 = (ulong *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_4e8.field_2._M_allocated_capacity = *puVar18;
              local_4e8.field_2._8_8_ = plVar16[3];
            }
            else {
              local_4e8.field_2._M_allocated_capacity = *puVar18;
              local_4e8._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_4e8._M_string_length = plVar16[1];
            *plVar16 = (long)puVar18;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_4e8,local_4c8._0_8_);
            local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
            psVar17 = (size_type *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_518.field_2._M_allocated_capacity = *psVar17;
              local_518.field_2._8_8_ = plVar16[3];
            }
            else {
              local_518.field_2._M_allocated_capacity = *psVar17;
              local_518._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_518._M_string_length = plVar16[1];
            *plVar16 = (long)psVar17;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_518,*(ulong *)(*plVar15 + 8));
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            puVar18 = (ulong *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_548.field_2._M_allocated_capacity = *puVar18;
              local_548.field_2._8_8_ = plVar16[3];
            }
            else {
              local_548.field_2._M_allocated_capacity = *puVar18;
              local_548._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_548._M_string_length = plVar16[1];
            *plVar16 = (long)puVar18;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_548,1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_dataplus._M_p != &local_518.field_2) {
              operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_488 != &local_478) {
              operator_delete(local_488,local_478 + 1);
            }
            uVar13 = local_458._M_allocated_capacity;
            _Var23._M_p = (pointer)local_468;
            if (local_468 != &local_458) goto LAB_002fc0f3;
          }
        }
        if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 5)
            == '\x01') {
          iVar11 = (**(code **)(*(long *)*plVar15 + 0x30))
                             ((long *)*plVar15,
                              ((local_520._M_head_impl)->super_ParserState).prev_cursor_,filepath,
                              local_4c8);
          if (iVar11 == 1) {
            (**(code **)(*(long *)*plVar15 + 0x60))(&local_518);
            plVar16 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_518,0,(char *)0x0,0x37edc6);
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            puVar18 = (ulong *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_548.field_2._M_allocated_capacity = *puVar18;
              local_548.field_2._8_8_ = plVar16[3];
            }
            else {
              local_548.field_2._M_allocated_capacity = *puVar18;
              local_548._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_548._M_string_length = plVar16[1];
            *plVar16 = (long)puVar18;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_548,1,1);
          }
          else {
            if (iVar11 != 3) goto LAB_002fc26d;
            (**(code **)(*(long *)*plVar15 + 0x60))(&local_518);
            plVar16 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_518,0,(char *)0x0,0x37ed98);
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            puVar18 = (ulong *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_548.field_2._M_allocated_capacity = *puVar18;
              local_548.field_2._8_8_ = plVar16[3];
            }
            else {
              local_548.field_2._M_allocated_capacity = *puVar18;
              local_548._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_548._M_string_length = plVar16[1];
            *plVar16 = (long)puVar18;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            (**(code **)((long)&(options->opts).cpp_object_api_pointer_type.field_2 + 8))
                      (options,&local_548,1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
        }
LAB_002fc26d:
      }
      if (local_340._368_8_ != 0) {
        bVar9 = Parser::SetRootType((Parser *)
                                    ((local_520._M_head_impl)->super_ParserState).prev_cursor_,
                                    (char *)local_340._360_8_);
        if (bVar9) {
          if (*(char *)(*(long *)(((local_520._M_head_impl)->super_ParserState).prev_cursor_ + 0x2f8
                                 ) + 0x110) != '\x01') goto LAB_002fc52c;
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_548,"root type must be a table","");
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,&local_548,1,1);
        }
        else {
          std::operator+(&local_548,"unknown root type: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_340 + 0x168));
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,&local_548,1,1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
      }
LAB_002fc52c:
      Parser::MarkGenerated((Parser *)((local_520._M_head_impl)->super_ParserState).prev_cursor_);
      if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
        operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p,
                        CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                                 local_440.field_2._M_local_buf[0]) + 1);
      }
      IDLOptions::~IDLOptions((IDLOptions *)local_340);
      local_4f8 = local_4f8 + 1;
    } while (local_4f8 !=
             (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    ;
  }
  return (__uniq_ptr_data<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>,_true,_true>
         )(tuple<flatbuffers::Parser_*,_std::default_delete<flatbuffers::Parser>_>)
          local_520._M_head_impl;
}

Assistant:

std::unique_ptr<Parser> FlatCompiler::GenerateCode(const FlatCOptions &options,
                                                   Parser &conform_parser) {
  std::unique_ptr<Parser> parser =
      std::unique_ptr<Parser>(new Parser(options.opts));

  for (auto file_it = options.filenames.begin();
       file_it != options.filenames.end(); ++file_it) {
    IDLOptions opts = options.opts;

    auto &filename = *file_it;
    std::string contents;
    if (!flatbuffers::LoadFile(filename.c_str(), true, &contents))
      Error("unable to load file: " + filename);

    bool is_binary = static_cast<size_t>(file_it - options.filenames.begin()) >=
                     options.binary_files_from;
    auto ext = flatbuffers::GetExtension(filename);
    const bool is_schema = ext == "fbs" || ext == "proto";
    if (is_schema && opts.project_root.empty()) {
      opts.project_root = StripFileName(filename);
    }
    const bool is_binary_schema = ext == reflection::SchemaExtension();
    if (is_binary) {
      parser->builder_.Clear();
      parser->builder_.PushFlatBuffer(
          reinterpret_cast<const uint8_t *>(contents.c_str()),
          contents.length());
      if (!options.raw_binary) {
        // Generally reading binaries that do not correspond to the schema
        // will crash, and sadly there's no way around that when the binary
        // does not contain a file identifier.
        // We'd expect that typically any binary used as a file would have
        // such an identifier, so by default we require them to match.
        if (!parser->file_identifier_.length()) {
          Error("current schema has no file_identifier: cannot test if \"" +
                filename +
                "\" matches the schema, use --raw-binary to read this file"
                " anyway.");
        } else if (!flatbuffers::BufferHasIdentifier(
                       contents.c_str(), parser->file_identifier_.c_str(),
                       opts.size_prefixed)) {
          Error("binary \"" + filename +
                "\" does not have expected file_identifier \"" +
                parser->file_identifier_ +
                "\", use --raw-binary to read this file anyway.");
        }
      }
    } else {
      // Check if file contains 0 bytes.
      if (!opts.use_flexbuffers && !is_binary_schema &&
          contents.length() != strlen(contents.c_str())) {
        Error("input file appears to be binary: " + filename, true);
      }
      if (is_schema || is_binary_schema) {
        // If we're processing multiple schemas, make sure to start each
        // one from scratch. If it depends on previous schemas it must do
        // so explicitly using an include.
        parser.reset(new Parser(opts));
      }
      // Try to parse the file contents (binary schema/flexbuffer/textual
      // schema)
      if (is_binary_schema) {
        LoadBinarySchema(*parser, filename, contents);
      } else if (opts.use_flexbuffers) {
        if (opts.lang_to_generate == IDLOptions::kJson) {
          auto data = reinterpret_cast<const uint8_t *>(contents.c_str());
          auto size = contents.size();
          std::vector<uint8_t> reuse_tracker;
          if (!flexbuffers::VerifyBuffer(data, size, &reuse_tracker))
            Error("flexbuffers file failed to verify: " + filename, false);
          parser->flex_root_ = flexbuffers::GetRoot(data, size);
        } else {
          parser->flex_builder_.Clear();
          ParseFile(*parser, filename, contents, options.include_directories);
        }
      } else {
        ParseFile(*parser, filename, contents, options.include_directories);
        if (!is_schema && !parser->builder_.GetSize()) {
          // If a file doesn't end in .fbs, it must be json/binary. Ensure we
          // didn't just parse a schema with a different extension.
          Error("input file is neither json nor a .fbs (schema) file: " +
                    filename,
                true);
        }
      }
      if ((is_schema || is_binary_schema) &&
          !options.conform_to_schema.empty()) {
        auto err = parser->ConformTo(conform_parser);
        if (!err.empty()) Error("schemas don\'t conform: " + err, false);
      }
      if (options.schema_binary || opts.binary_schema_gen_embed) {
        parser->Serialize();
      }
      if (options.schema_binary) {
        parser->file_extension_ = reflection::SchemaExtension();
      }
    }
    std::string filebase =
        flatbuffers::StripPath(flatbuffers::StripExtension(filename));

    // If one of the generators uses bfbs, serialize the parser and get
    // the serialized buffer and length.
    const uint8_t *bfbs_buffer = nullptr;
    int64_t bfbs_length = 0;
    if (options.requires_bfbs) {
      parser->Serialize();
      bfbs_buffer = parser->builder_.GetBufferPointer();
      bfbs_length = parser->builder_.GetSize();
    }

    for (const std::shared_ptr<CodeGenerator> &code_generator :
         options.generators) {
      if (options.print_make_rules) {
        std::string make_rule;
        const CodeGenerator::Status status = code_generator->GenerateMakeRule(
            *parser, options.output_path, filename, make_rule);
        if (status == CodeGenerator::Status::OK && !make_rule.empty()) {
          printf("%s\n",
                 flatbuffers::WordWrap(make_rule, 80, " ", " \\").c_str());
        } else {
          Error("Cannot generate make rule for " +
                code_generator->LanguageName());
        }
      } else {
        flatbuffers::EnsureDirExists(options.output_path);

        // Prefer bfbs generators if present.
        if (code_generator->SupportsBfbsGeneration()) {
          CodeGenOptions code_gen_options;
          code_gen_options.output_path = options.output_path;

          const CodeGenerator::Status status = code_generator->GenerateCode(
              bfbs_buffer, bfbs_length, code_gen_options);
          if (status != CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail +
                  " using bfbs generator.");
          }
        } else {
          if ((!code_generator->IsSchemaOnly() ||
               (is_schema || is_binary_schema)) &&
              code_generator->GenerateCode(*parser, options.output_path,
                                           filebase) !=
                  CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail);
          }
        }
      }

      if (options.grpc_enabled) {
        const CodeGenerator::Status status = code_generator->GenerateGrpcCode(
            *parser, options.output_path, filebase);

        if (status == CodeGenerator::Status::NOT_IMPLEMENTED) {
          Warn("GRPC interface generator not implemented for " +
               code_generator->LanguageName());
        } else if (status == CodeGenerator::Status::ERROR) {
          Error("Unable to generate GRPC interface for " +
                code_generator->LanguageName());
        }
      }
    }

    if (!opts.root_type.empty()) {
      if (!parser->SetRootType(opts.root_type.c_str()))
        Error("unknown root type: " + opts.root_type);
      else if (parser->root_struct_def_->fixed)
        Error("root type must be a table");
    }

    // We do not want to generate code for the definitions in this file
    // in any files coming up next.
    parser->MarkGenerated();
  }

  return parser;
}